

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubtreeWrapper.cpp
# Opt level: O2

unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_> __thiscall
IRT::CAndConditionalWrapper::ToConditional
          (CAndConditionalWrapper *this,CLabel *labelTrue,CLabel *labelFalse)

{
  long *plVar1;
  CSeqStatement *this_00;
  CSeqStatement *this_01;
  CLabelStatement *this_02;
  string *in_RCX;
  pointer *__ptr;
  _Head_base<0UL,_const_IRT::CStatement_*,_false> local_128;
  _Head_base<0UL,_const_IRT::CStatement_*,_false> local_120;
  _Head_base<0UL,_const_IRT::CStatement_*,_false> local_118;
  _Head_base<0UL,_const_IRT::CStatement_*,_false> local_110;
  _Head_base<0UL,_const_IRT::CStatement_*,_false> local_108;
  _Head_base<0UL,_const_IRT::CStatement_*,_false> local_100;
  CSeqStatement *local_f8;
  CLabel labelMiddle;
  string local_d0 [32];
  string local_b0 [32];
  CLabel local_90;
  string local_70 [32];
  string local_50 [32];
  
  CLabel::CLabel(&labelMiddle);
  local_f8 = (CSeqStatement *)operator_new(0x18);
  plVar1 = (long *)(labelTrue->label)._M_string_length;
  std::__cxx11::string::string(local_50,(string *)&labelMiddle);
  std::__cxx11::string::string(local_70,in_RCX);
  (**(code **)(*plVar1 + 0x10))(&local_120,plVar1,local_50,local_70);
  local_110._M_head_impl = local_120._M_head_impl;
  local_120._M_head_impl = (CStatement *)0x0;
  this_01 = (CSeqStatement *)operator_new(0x18);
  this_02 = (CLabelStatement *)operator_new(0x28);
  std::__cxx11::string::string((string *)&local_90,(string *)&labelMiddle);
  CLabelStatement::CLabelStatement(this_02,&local_90);
  plVar1 = *(long **)&(labelTrue->label).field_2;
  local_118._M_head_impl = (CStatement *)this_02;
  std::__cxx11::string::string(local_b0,(string *)labelFalse);
  this_00 = local_f8;
  std::__cxx11::string::string(local_d0,in_RCX);
  (**(code **)(*plVar1 + 0x10))(&local_128,plVar1,local_b0,local_d0);
  local_108._M_head_impl = local_128._M_head_impl;
  local_128._M_head_impl = (CStatement *)0x0;
  CSeqStatement::CSeqStatement
            (this_01,(unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>
                      *)&local_118,
             (unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_> *)
             &local_108);
  local_100._M_head_impl = (CStatement *)this_01;
  CSeqStatement::CSeqStatement
            (this_00,(unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>
                      *)&local_110,
             (unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_> *)
             &local_100);
  (this->super_CConditionalWrapper).super_ISubtreeWrapper._vptr_ISubtreeWrapper =
       (_func_int **)this_00;
  if ((CSeqStatement *)local_100._M_head_impl != (CSeqStatement *)0x0) {
    (*((INode *)&((local_100._M_head_impl)->super_IStatement).super_INode._vptr_INode)->_vptr_INode
      [2])();
  }
  local_100._M_head_impl = (CStatement *)0x0;
  if (local_108._M_head_impl != (CStatement *)0x0) {
    (*((local_108._M_head_impl)->super_IStatement).super_INode._vptr_INode[2])();
  }
  local_108._M_head_impl = (CStatement *)0x0;
  if (local_128._M_head_impl != (CStatement *)0x0) {
    (*((local_128._M_head_impl)->super_IStatement).super_INode._vptr_INode[2])();
  }
  local_128._M_head_impl = (CStatement *)0x0;
  std::__cxx11::string::~string(local_d0);
  std::__cxx11::string::~string(local_b0);
  if ((CLabelStatement *)local_118._M_head_impl != (CLabelStatement *)0x0) {
    (*((INode *)&((local_118._M_head_impl)->super_IStatement).super_INode._vptr_INode)->_vptr_INode
      [2])();
  }
  local_118._M_head_impl = (CStatement *)0x0;
  std::__cxx11::string::~string((string *)&local_90);
  if (local_110._M_head_impl != (CStatement *)0x0) {
    (*((local_110._M_head_impl)->super_IStatement).super_INode._vptr_INode[2])();
  }
  local_110._M_head_impl = (CStatement *)0x0;
  if (local_120._M_head_impl != (CStatement *)0x0) {
    (*((local_120._M_head_impl)->super_IStatement).super_INode._vptr_INode[2])();
  }
  local_120._M_head_impl = (CStatement *)0x0;
  std::__cxx11::string::~string(local_70);
  std::__cxx11::string::~string(local_50);
  std::__cxx11::string::~string((string *)&labelMiddle);
  return (__uniq_ptr_data<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>,_true,_true>
          )(__uniq_ptr_data<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<const CStatement> CAndConditionalWrapper::ToConditional( CLabel labelTrue, CLabel labelFalse ) {
        CLabel labelMiddle;
        return std::move( std::unique_ptr<const CStatement>(
                new CSeqStatement(
                        std::move( operandLeft->ToConditional( labelMiddle, labelFalse )),
                        std::move( std::unique_ptr<const CStatement>(
                                new CSeqStatement(
                                        std::move( std::unique_ptr<const CStatement>(
                                                new CLabelStatement( labelMiddle ))),
                                        std::move( operandRight->ToConditional( labelTrue, labelFalse ))
                                )
                        ))
                )
        ));
    }